

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Glucose::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  Lit p;
  Lit p_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  CRef CVar6;
  Clause *this_00;
  Lit *pLVar7;
  uint *t;
  SimpSolver *this_01;
  int *piVar8;
  uchar *puVar9;
  Lit in_EDX;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  uchar *puVar10;
  long in_RDI;
  size_t in_R8;
  Solver *unaff_retaddr;
  bool in_stack_0000003b;
  CRef in_stack_0000003c;
  Solver *in_stack_00000040;
  Solver *in_stack_00000078;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Clause *c;
  undefined4 in_stack_ffffffffffffff28;
  Ref in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  Var v;
  vec<unsigned_int> *in_stack_ffffffffffffff40;
  FILE *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Lit in_stack_ffffffffffffff64;
  FILE *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint local_54;
  uint local_48;
  uint local_34;
  uint local_24;
  
  this_00 = ClauseAllocator::operator[]
                      ((ClauseAllocator *)
                       CONCAT17(in_stack_ffffffffffffff37,
                                CONCAT16(in_stack_ffffffffffffff36,
                                         CONCAT24(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30))),
                       in_stack_ffffffffffffff2c);
  Queue<unsigned_int>::insert
            ((Queue<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  if ((*(byte *)(in_RDI + 0xc0) & 1) != 0) {
    if ((*(byte *)(in_RDI + 0xc1) & 1) == 0) {
      local_34 = 0;
      while( true ) {
        in_stack_ffffffffffffff74 = local_34;
        uVar3 = Clause::size(this_00);
        puVar9 = (uchar *)(ulong)uVar3;
        if ((int)uVar3 <= (int)in_stack_ffffffffffffff74) break;
        pLVar7 = Clause::operator[](this_00,local_34);
        bVar1 = Lit::operator!=(pLVar7,in_EDX);
        if (bVar1) {
          in_stack_ffffffffffffff68 = *(FILE **)(in_RDI + 0xb8);
          pLVar7 = Clause::operator[](this_00,local_34);
          iVar4 = var((Lit)pLVar7->x);
          in_stack_ffffffffffffff64.x = iVar4 + 1;
          puVar10 = (uchar *)(ulong)local_34;
          pLVar7 = Clause::operator[](this_00,local_34);
          iVar4 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,puVar10,siglen_00,puVar9,in_R8);
          fprintf(in_stack_ffffffffffffff68,"%i ",
                  (ulong)(in_stack_ffffffffffffff64.x * ((uint)((byte)iVar4 & 1) * -2 + 1)));
        }
        local_34 = local_34 + 1;
      }
      fprintf(*(FILE **)(in_RDI + 0xb8),"0\n");
    }
    else {
      Solver::write_char((Solver *)
                         CONCAT17(in_stack_ffffffffffffff37,
                                  CONCAT16(in_stack_ffffffffffffff36,
                                           CONCAT24(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30))),
                         (uchar)(in_stack_ffffffffffffff2c >> 0x18));
      local_24 = 0;
      while( true ) {
        uVar3 = Clause::size(this_00);
        puVar9 = (uchar *)(ulong)uVar3;
        if ((int)uVar3 <= (int)local_24) break;
        pLVar7 = Clause::operator[](this_00,local_24);
        bVar1 = Lit::operator!=(pLVar7,in_EDX);
        if (bVar1) {
          pLVar7 = Clause::operator[](this_00,local_24);
          var((Lit)pLVar7->x);
          puVar10 = (uchar *)(ulong)local_24;
          pLVar7 = Clause::operator[](this_00,local_24);
          sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,puVar10,siglen,puVar9,in_R8);
          Solver::write_lit((Solver *)
                            CONCAT17(in_stack_ffffffffffffff37,
                                     CONCAT16(in_stack_ffffffffffffff36,
                                              CONCAT24(in_stack_ffffffffffffff34,
                                                       in_stack_ffffffffffffff30))),
                            in_stack_ffffffffffffff2c);
        }
        local_24 = local_24 + 1;
      }
      Solver::write_lit((Solver *)
                        CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,
                                          CONCAT24(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30))),
                        in_stack_ffffffffffffff2c);
    }
  }
  iVar4 = Clause::size(this_00);
  CVar6 = (CRef)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  if (iVar4 == 2) {
    removeClause((SimpSolver *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (CRef)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
    p.x._2_1_ = in_stack_ffffffffffffff36;
    p.x._0_2_ = in_stack_ffffffffffffff34;
    p.x._3_1_ = in_stack_ffffffffffffff37;
    Clause::strengthen((Clause *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),p);
  }
  else {
    if ((*(byte *)(in_RDI + 0xc0) & 1) != 0) {
      if ((*(byte *)(in_RDI + 0xc1) & 1) == 0) {
        fprintf(*(FILE **)(in_RDI + 0xb8),"d ");
        local_54 = 0;
        while( true ) {
          CVar6 = (CRef)((ulong)in_stack_ffffffffffffff50 >> 0x20);
          in_stack_ffffffffffffff58 = local_54;
          uVar3 = Clause::size(this_00);
          puVar9 = (uchar *)(ulong)uVar3;
          if ((int)uVar3 <= (int)in_stack_ffffffffffffff58) break;
          in_stack_ffffffffffffff50 = *(FILE **)(in_RDI + 0xb8);
          pLVar7 = Clause::operator[](this_00,local_54);
          iVar4 = var((Lit)pLVar7->x);
          puVar10 = (uchar *)(ulong)local_54;
          pLVar7 = Clause::operator[](this_00,local_54);
          iVar5 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,puVar10,siglen_02,puVar9,in_R8);
          fprintf(in_stack_ffffffffffffff50,"%i ",
                  (ulong)((iVar4 + 1) * ((uint)((byte)iVar5 & 1) * -2 + 1)));
          local_54 = local_54 + 1;
        }
        fprintf(*(FILE **)(in_RDI + 0xb8),"0\n");
      }
      else {
        Solver::write_char((Solver *)
                           CONCAT17(in_stack_ffffffffffffff37,
                                    CONCAT16(in_stack_ffffffffffffff36,
                                             CONCAT24(in_stack_ffffffffffffff34,
                                                      in_stack_ffffffffffffff30))),
                           (uchar)(in_stack_ffffffffffffff2c >> 0x18));
        local_48 = 0;
        while( true ) {
          uVar3 = Clause::size(this_00);
          CVar6 = (CRef)((ulong)in_stack_ffffffffffffff50 >> 0x20);
          puVar9 = (uchar *)(ulong)uVar3;
          if ((int)uVar3 <= (int)local_48) break;
          pLVar7 = Clause::operator[](this_00,local_48);
          iVar4 = var((Lit)pLVar7->x);
          in_stack_ffffffffffffff5c = (iVar4 + 1) * 2;
          puVar10 = (uchar *)(ulong)local_48;
          pLVar7 = Clause::operator[](this_00,local_48);
          sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,puVar10,siglen_01,puVar9,in_R8);
          Solver::write_lit((Solver *)
                            CONCAT17(in_stack_ffffffffffffff37,
                                     CONCAT16(in_stack_ffffffffffffff36,
                                              CONCAT24(in_stack_ffffffffffffff34,
                                                       in_stack_ffffffffffffff30))),
                            in_stack_ffffffffffffff2c);
          local_48 = local_48 + 1;
        }
        Solver::write_lit((Solver *)
                          CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36,
                                            CONCAT24(in_stack_ffffffffffffff34,
                                                     in_stack_ffffffffffffff30))),
                          in_stack_ffffffffffffff2c);
      }
    }
    Solver::detachClause(in_stack_00000040,in_stack_0000003c,in_stack_0000003b);
    p_00.x._2_1_ = in_stack_ffffffffffffff36;
    p_00.x._0_2_ = in_stack_ffffffffffffff34;
    p_00.x._3_1_ = in_stack_ffffffffffffff37;
    Clause::strengthen((Clause *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),p_00)
    ;
    Solver::attachClause(unaff_retaddr,in_EDX.x);
    t = (uint *)(in_RDI + 0x4f8);
    var(in_EDX);
    OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::operator[]
              ((OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,
                                 CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))),
               (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    remove<Glucose::vec<unsigned_int>,unsigned_int>(in_stack_ffffffffffffff40,t);
    v = (Var)((ulong)t >> 0x20);
    this_01 = (SimpSolver *)(in_RDI + 0x530);
    iVar4 = toInt(in_EDX);
    piVar8 = vec<int>::operator[]((vec<int> *)this_01,iVar4);
    *piVar8 = *piVar8 + -1;
    var(in_EDX);
    updateElimHeap(this_01,v);
  }
  iVar4 = Clause::size(this_00);
  if (iVar4 == 1) {
    Clause::operator[](this_00,0);
    bVar2 = Solver::enqueue((Solver *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            in_stack_ffffffffffffff64,CVar6);
    bVar1 = false;
    if (bVar2) {
      CVar6 = Solver::propagate(in_stack_00000078);
      bVar1 = CVar6 == 0xffffffff;
    }
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (certifiedUNSAT) {
        if (vbyte) {
            write_char('a');
            for (int i = 0; i < c.size(); i++)
                if (c[i] != l) write_lit(2*(var(c[i])+1) + sign(c[i]));
            write_lit(0);
        }
        else {
            for (int i = 0; i < c.size(); i++)
                if (c[i] != l) fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
            fprintf(certifiedOutput, "0\n");
        }
    }

    if (c.size() == 2){
        removeClause(cr);
        c.strengthen(l);
    }else{
        if (certifiedUNSAT) {
            if (vbyte) {
                write_char('d');
                for (int i = 0; i < c.size(); i++)
                    write_lit(2*(var(c[i])+1) + sign(c[i]));
                write_lit(0);
            }
            else {
                fprintf(certifiedOutput, "d ");
                for (int i = 0; i < c.size(); i++)
                    fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
                fprintf(certifiedOutput, "0\n");
            }
        }

        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[toInt(l)]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}